

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::memory_pool<char>::allocate_node
          (memory_pool<char> *this,node_type type,char *name,char *value,size_t name_size,
          size_t value_size)

{
  xml_node<char> *this_00;
  xml_node<char> *node;
  void *memory;
  size_t value_size_local;
  size_t name_size_local;
  char *value_local;
  char *name_local;
  node_type type_local;
  memory_pool<char> *this_local;
  
  this_00 = (xml_node<char> *)allocate_aligned(this,0x60);
  xml_node<char>::xml_node(this_00,type);
  if (name != (char *)0x0) {
    if (name_size == 0) {
      xml_base<char>::name((xml_base<char> *)this_00,name);
    }
    else {
      xml_base<char>::name((xml_base<char> *)this_00,name,name_size);
    }
  }
  if (value != (char *)0x0) {
    if (value_size == 0) {
      xml_base<char>::value((xml_base<char> *)this_00,value);
    }
    else {
      xml_base<char>::value((xml_base<char> *)this_00,value,value_size);
    }
  }
  return this_00;
}

Assistant:

xml_node<Ch> *allocate_node(node_type type, 
                                    const Ch *name = 0, const Ch *value = 0, 
                                    std::size_t name_size = 0, std::size_t value_size = 0)
        {
            void *memory = allocate_aligned(sizeof(xml_node<Ch>));
            xml_node<Ch> *node = new(memory) xml_node<Ch>(type);
            if (name)
            {
                if (name_size > 0)
                    node->name(name, name_size);
                else
                    node->name(name);
            }
            if (value)
            {
                if (value_size > 0)
                    node->value(value, value_size);
                else
                    node->value(value);
            }
            return node;
        }